

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callbacks.c
# Opt level: O0

int enet_initialize_with_callbacks(ENetVersion version,ENetCallbacks *inits)

{
  long *in_RSI;
  uint in_EDI;
  int local_4;
  
  if (in_EDI < 0x10300) {
    local_4 = -1;
  }
  else {
    if ((*in_RSI != 0) || (in_RSI[1] != 0)) {
      if ((*in_RSI == 0) || (in_RSI[1] == 0)) {
        return -1;
      }
      callbacks.malloc = (_func_void_ptr_size_t *)*in_RSI;
      callbacks.free = (_func_void_void_ptr *)in_RSI[1];
    }
    if (in_RSI[2] != 0) {
      callbacks.no_memory = (_func_void *)in_RSI[2];
    }
    local_4 = enet_initialize();
  }
  return local_4;
}

Assistant:

int
enet_initialize_with_callbacks (ENetVersion version, const ENetCallbacks * inits)
{
   if (version < ENET_VERSION_CREATE (1, 3, 0))
     return -1;

   if (inits -> malloc != NULL || inits -> free != NULL)
   {
      if (inits -> malloc == NULL || inits -> free == NULL)
        return -1;

      callbacks.malloc = inits -> malloc;
      callbacks.free = inits -> free;
   }
      
   if (inits -> no_memory != NULL)
     callbacks.no_memory = inits -> no_memory;

   return enet_initialize ();
}